

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-proxy.c
# Opt level: O3

void print_buffer(char *buffer,size_t size)

{
  size_t sVar1;
  
  printf("%.*s [",size,buffer);
  if (size != 0) {
    sVar1 = 0;
    do {
      printf("<0x%02X>",(ulong)(byte)buffer[sVar1]);
      if (buffer[sVar1] == '\n') {
        putchar(10);
      }
      sVar1 = sVar1 + 1;
    } while (size != sVar1);
  }
  putchar(0x5d);
  return;
}

Assistant:

static void print_buffer(const char *buffer, size_t size) {
	size_t i;

	printf("%.*s [", (int)size, buffer);
	for (i = 0; i != size; ++i) {
		printf("<" COLOR_BOLD "0x%02X" COLOR_UNBOLD ">", (unsigned char)buffer[i]);
		if(buffer[i] == '\n') printf("%c", '\n');
	}
	printf("]");
}